

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_Choice.H
# Opt level: O2

void __thiscall Fl_Input_Choice::InputMenuButton::draw(InputMenuButton *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Color c;
  int iVar5;
  
  Fl_Widget::draw_box((Fl_Widget *)this,FL_UP_BOX,
                      (this->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget.color_);
  iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
  c = (this->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget.label_.color;
  if (iVar4 == 0) {
    c = fl_inactive(c);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)c);
  iVar3 = (this->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget.w_ / 2;
  iVar4 = (this->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget.x_;
  iVar2 = (this->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget.y_;
  iVar5 = (this->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget.h_ / 2;
  uVar1 = iVar5 + -3 + iVar2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
            (fl_graphics_driver,(ulong)((iVar3 + iVar4) - 5),(ulong)uVar1,
             (ulong)(uint)(iVar3 + 5 + iVar4),(ulong)uVar1,(ulong)(uint)(iVar3 + iVar4),
             iVar5 + 3 + iVar2);
  if (Fl::focus_ != (Fl_Widget *)this) {
    return;
  }
  Fl_Widget::draw_focus((Fl_Widget *)this);
  return;
}

Assistant:

void draw() {
      draw_box(FL_UP_BOX, color());
      fl_color(active_r() ? labelcolor() : fl_inactive(labelcolor()));
      int xc = x()+w()/2, yc=y()+h()/2;
      fl_polygon(xc-5,yc-3,xc+5,yc-3,xc,yc+3);
      if (Fl::focus() == this) draw_focus();
    }